

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml-parser.c
# Opt level: O0

coda_mem_record *
attribute_record_new
          (coda_type_record *definition,coda_xml_product *product,char *el,char **attr,
          int update_definition)

{
  hashtable *table;
  coda_type *pcVar1;
  char **ppcVar2;
  int iVar3;
  char **ppcVar4;
  long lVar5;
  coda_type_text *definition_00;
  char *pcVar6;
  char *pcVar7;
  size_t length;
  char *local_78;
  char *real_name_1;
  coda_type_text *attribute_definition_1;
  char *real_name;
  coda_type_text *attribute_definition;
  int local_50;
  int i;
  int attribute_index;
  int update_mem_record;
  coda_mem_data *attribute;
  coda_mem_record *attributes;
  char **ppcStack_30;
  int update_definition_local;
  char **attr_local;
  char *el_local;
  coda_xml_product *product_local;
  coda_type_record *definition_local;
  
  i = update_definition;
  attributes._4_4_ = update_definition;
  ppcStack_30 = attr;
  attr_local = (char **)el;
  el_local = (char *)product;
  product_local = (coda_xml_product *)definition;
  if (definition == (coda_type_record *)0x0) {
    __assert_fail("definition != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x61,
                  "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                 );
  }
  if (definition->is_union != 0) {
    __assert_fail("!definition->is_union",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                  ,0x62,
                  "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                 );
  }
  attribute = (coda_mem_data *)coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
  ppcVar2 = attr_local;
  ppcVar4 = (char **)coda_element_name_from_xml_name((char *)attr_local);
  if (ppcVar2 != ppcVar4) {
    lVar5 = coda_hashtable_get_index_from_name((hashtable *)product_local->mem_ptr,"xmlns");
    pcVar7 = el_local;
    local_50 = (int)lVar5;
    if (attributes._4_4_ == 0) {
      if (-1 < local_50) {
        pcVar1 = *(coda_type **)(*(long *)(product_local[1].filename + (long)local_50 * 8) + 0x10);
        pcVar6 = coda_element_name_from_xml_name((char *)attr_local);
        _attribute_index =
             coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)pcVar7,
                               (long)(pcVar6 + (-1 - (long)attr_local)),(uint8_t *)attr_local);
        if (_attribute_index == (coda_mem_data *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)attribute);
          return (coda_mem_record *)0x0;
        }
        iVar3 = coda_mem_record_add_field
                          ((coda_mem_record *)attribute,"xmlns",
                           (coda_dynamic_type *)_attribute_index,i);
        if (iVar3 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)_attribute_index);
          coda_dynamic_type_delete((coda_dynamic_type *)attribute);
          return (coda_mem_record *)0x0;
        }
      }
    }
    else {
      if (local_50 < 0) {
        definition_00 = coda_type_text_new(coda_format_xml);
        pcVar7 = el_local;
        real_name = (char *)definition_00;
        if (definition_00 == (coda_type_text *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)attribute);
          return (coda_mem_record *)0x0;
        }
        pcVar6 = coda_element_name_from_xml_name((char *)attr_local);
        _attribute_index =
             coda_mem_data_new((coda_type *)definition_00,(coda_dynamic_type *)0x0,
                               (coda_product *)pcVar7,(long)(pcVar6 + (-1 - (long)attr_local)),
                               (uint8_t *)attr_local);
        coda_type_release((coda_type *)real_name);
      }
      else {
        if (*(long *)(attribute->offset + (long)local_50 * 8) != 0) {
          __assert_fail("attributes->field_type[attribute_index] == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml-parser.c"
                        ,0x7c,
                        "coda_mem_record *attribute_record_new(coda_type_record *, coda_xml_product *, const char *, const char **, int)"
                       );
        }
        pcVar1 = *(coda_type **)(*(long *)(product_local[1].filename + (long)local_50 * 8) + 0x10);
        pcVar6 = coda_element_name_from_xml_name((char *)attr_local);
        _attribute_index =
             coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)pcVar7,
                               (long)(pcVar6 + (-1 - (long)attr_local)),(uint8_t *)attr_local);
        i = 0;
      }
      if (_attribute_index == (coda_mem_data *)0x0) {
        coda_dynamic_type_delete((coda_dynamic_type *)attribute);
        return (coda_mem_record *)0x0;
      }
      iVar3 = coda_mem_record_add_field
                        ((coda_mem_record *)attribute,"xmlns",(coda_dynamic_type *)_attribute_index,
                         i);
      if (iVar3 != 0) {
        coda_dynamic_type_delete((coda_dynamic_type *)_attribute_index);
        coda_dynamic_type_delete((coda_dynamic_type *)attribute);
        return (coda_mem_record *)0x0;
      }
    }
  }
  attribute_definition._4_4_ = 0;
  do {
    if (ppcStack_30[attribute_definition._4_4_ << 1] == (char *)0x0) {
      attribute_definition._4_4_ = 0;
      do {
        if ((long)product_local->raw_product <= (long)attribute_definition._4_4_) {
          return (coda_mem_record *)attribute;
        }
        if ((*(char *)(*(long *)(product_local[1].filename + (long)attribute_definition._4_4_ * 8) +
                      0x1c) == '\0') &&
           (*(long *)(attribute->offset + (long)attribute_definition._4_4_ * 8) == 0)) {
          if (attributes._4_4_ == 0) {
            coda_type_get_record_field_real_name
                      ((coda_type *)product_local,(long)attribute_definition._4_4_,&local_78);
            coda_set_error(-300,"mandatory xml attribute \'%s\' is missing",local_78);
            coda_dynamic_type_delete((coda_dynamic_type *)attribute);
            return (coda_mem_record *)0x0;
          }
          *(undefined1 *)
           (*(long *)(product_local[1].filename + (long)attribute_definition._4_4_ * 8) + 0x1c) = 1;
        }
        attribute_definition._4_4_ = attribute_definition._4_4_ + 1;
      } while( true );
    }
    attribute_definition_1 = (coda_type_text *)ppcStack_30[attribute_definition._4_4_ << 1];
    i = attributes._4_4_;
    lVar5 = coda_hashtable_get_index_from_name
                      ((hashtable *)product_local->mem_ptr,(char *)attribute_definition_1);
    local_50 = (int)lVar5;
    if (local_50 < 0) {
      table = (hashtable *)product_local->mem_ptr;
      pcVar7 = coda_element_name_from_xml_name((char *)attribute_definition_1);
      lVar5 = coda_hashtable_get_index_from_name(table,pcVar7);
      local_50 = (int)lVar5;
      if (-1 < local_50) {
        attribute_definition_1 =
             (coda_type_text *)coda_element_name_from_xml_name((char *)attribute_definition_1);
      }
    }
    pcVar7 = el_local;
    if (attributes._4_4_ == 0) {
      if (local_50 == -1) {
        coda_set_error(-300,"xml attribute \'%s\' is not allowed",
                       ppcStack_30[attribute_definition._4_4_ << 1]);
        coda_dynamic_type_delete((coda_dynamic_type *)attribute);
        return (coda_mem_record *)0x0;
      }
      pcVar1 = *(coda_type **)(*(long *)(product_local[1].filename + (long)local_50 * 8) + 0x10);
      length = strlen(ppcStack_30[attribute_definition._4_4_ * 2 + 1]);
      _attribute_index =
           coda_mem_data_new(pcVar1,(coda_dynamic_type *)0x0,(coda_product *)pcVar7,length,
                             (uint8_t *)ppcStack_30[attribute_definition._4_4_ * 2 + 1]);
LAB_001af223:
      if (_attribute_index == (coda_mem_data *)0x0) {
        coda_dynamic_type_delete((coda_dynamic_type *)attribute);
        return (coda_mem_record *)0x0;
      }
      iVar3 = coda_mem_record_add_field
                        ((coda_mem_record *)attribute,(char *)attribute_definition_1,
                         (coda_dynamic_type *)_attribute_index,i);
      if (iVar3 != 0) {
        coda_dynamic_type_delete((coda_dynamic_type *)_attribute_index);
        coda_dynamic_type_delete((coda_dynamic_type *)attribute);
        return (coda_mem_record *)0x0;
      }
    }
    else {
      if (local_50 < 0) {
        real_name_1 = (char *)coda_type_text_new(coda_format_xml);
        if ((coda_type_text *)real_name_1 == (coda_type_text *)0x0) {
          coda_dynamic_type_delete((coda_dynamic_type *)attribute);
          return (coda_mem_record *)0x0;
        }
        _attribute_index =
             coda_mem_string_new((coda_type_text *)real_name_1,(coda_dynamic_type *)0x0,
                                 (coda_product *)el_local,
                                 ppcStack_30[attribute_definition._4_4_ * 2 + 1]);
        coda_type_release((coda_type *)real_name_1);
        goto LAB_001af223;
      }
      if (*(long *)(attribute->offset + (long)local_50 * 8) == 0) {
        _attribute_index =
             coda_mem_string_new(*(coda_type_text **)
                                  (*(long *)(product_local[1].filename + (long)local_50 * 8) + 0x10)
                                 ,(coda_dynamic_type *)0x0,(coda_product *)el_local,
                                 ppcStack_30[attribute_definition._4_4_ * 2 + 1]);
        i = 0;
        goto LAB_001af223;
      }
    }
    attribute_definition._4_4_ = attribute_definition._4_4_ + 1;
  } while( true );
}

Assistant:

static coda_mem_record *attribute_record_new(coda_type_record *definition, coda_xml_product *product, const char *el,
                                             const char **attr, int update_definition)
{
    coda_mem_record *attributes;
    coda_mem_data *attribute;
    int update_mem_record = update_definition;
    int attribute_index;
    int i;

    assert(definition != NULL);
    assert(!definition->is_union);
    attributes = coda_mem_record_new(definition, NULL);

    if (el != coda_element_name_from_xml_name(el))
    {
        /* store the namespace part of the full xml name as an 'xmlns' attribute */
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, "xmlns");
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_data_new((coda_type *)attribute_definition, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                coda_type_release((coda_type *)attribute_definition);
            }
            else
            {
                assert(attributes->field_type[attribute_index] == NULL);
                attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                              (long)(coda_element_name_from_xml_name(el) - el - 1),
                                              (const uint8_t *)el);
                update_mem_record = 0;
            }
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
        else if (attribute_index >= 0)
        {
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)(coda_element_name_from_xml_name(el) - el - 1), (const uint8_t *)el);
            if (attribute == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            if (coda_mem_record_add_field(attributes, "xmlns", (coda_dynamic_type *)attribute, update_mem_record) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attribute);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    /* add attributes to attribute list */
    for (i = 0; attr[2 * i] != NULL; i++)
    {
        const char *real_name = attr[2 * i];

        update_mem_record = update_definition;
        attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data, real_name);
        if (attribute_index < 0)
        {
            attribute_index = hashtable_get_index_from_name(definition->real_name_hash_data,
                                                            coda_element_name_from_xml_name(real_name));
            if (attribute_index >= 0)
            {
                real_name = coda_element_name_from_xml_name(real_name);
            }
        }
        if (update_definition)
        {
            if (attribute_index < 0)
            {
                coda_type_text *attribute_definition;

                attribute_definition = coda_type_text_new(coda_format_xml);
                if (attribute_definition == NULL)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    return NULL;
                }
                attribute = coda_mem_string_new(attribute_definition, NULL, (coda_product *)product, attr[2 * i + 1]);
                coda_type_release((coda_type *)attribute_definition);
            }
            else if (attributes->field_type[attribute_index] != NULL)
            {
                /* we only add the first occurrence when there are multiple attributes with the same attribute name */
                continue;
            }
            else
            {
                attribute = coda_mem_string_new((coda_type_text *)definition->field[attribute_index]->type, NULL,
                                                (coda_product *)product, attr[2 * i + 1]);
                update_mem_record = 0;
            }
        }
        else
        {
            if (attribute_index == -1)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "xml attribute '%s' is not allowed", attr[2 * i]);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
            attribute = coda_mem_data_new(definition->field[attribute_index]->type, NULL, (coda_product *)product,
                                          (long)strlen(attr[2 * i + 1]), (uint8_t *)attr[2 * i + 1]);
        }
        if (attribute == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }

        if (coda_mem_record_add_field(attributes, real_name, (coda_dynamic_type *)attribute, update_mem_record) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attribute);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            return NULL;
        }
    }

    for (i = 0; i < definition->num_fields; i++)
    {
        if (!definition->field[i]->optional && attributes->field_type[i] == NULL)
        {
            if (update_definition)
            {
                definition->field[i]->optional = 1;
            }
            else
            {
                const char *real_name;

                coda_type_get_record_field_real_name((coda_type *)definition, i, &real_name);
                coda_set_error(CODA_ERROR_PRODUCT, "mandatory xml attribute '%s' is missing", real_name);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                return NULL;
            }
        }
    }

    return attributes;
}